

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O0

TimePoint __thiscall hta::storage::file::Metric::epoch(Metric *this,Duration interval)

{
  TimePoint time;
  duration dVar1;
  Metric *this_local;
  Duration interval_local;
  
  time = epoch(this);
  dVar1.__r = (rep)interval_begin(time,interval);
  return (TimePoint)(duration)dVar1.__r;
}

Assistant:

TimePoint Metric::epoch(Duration interval)
{
    return interval_begin(epoch(), interval);
}